

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

Rune re2::ApplyFold(CaseFold *f,Rune r)

{
  int iVar1;
  Rune r_local;
  CaseFold *f_local;
  
  iVar1 = f->delta;
  if (iVar1 == -1) {
LAB_0019f20a:
    if (r % 2 == 1) {
      f_local._4_4_ = r + 1;
    }
    else {
      f_local._4_4_ = r + -1;
    }
  }
  else {
    if (iVar1 != 1) {
      if (iVar1 != 0x40000000) {
        if (iVar1 != 0x40000001) {
          return r + f->delta;
        }
        if ((r - f->lo) % 2 != 0) {
          return r;
        }
        goto LAB_0019f20a;
      }
      if ((r - f->lo) % 2 != 0) {
        return r;
      }
    }
    if (r % 2 == 0) {
      f_local._4_4_ = r + 1;
    }
    else {
      f_local._4_4_ = r + -1;
    }
  }
  return f_local._4_4_;
}

Assistant:

Rune ApplyFold(const CaseFold *f, Rune r) {
  switch (f->delta) {
    default:
      return r + f->delta;

    case EvenOddSkip:  // even <-> odd but only applies to every other
      if ((r - f->lo) % 2)
        return r;
      // fall through
    case EvenOdd:  // even <-> odd
      if (r%2 == 0)
        return r + 1;
      return r - 1;

    case OddEvenSkip:  // odd <-> even but only applies to every other
      if ((r - f->lo) % 2)
        return r;
      // fall through
    case OddEven:  // odd <-> even
      if (r%2 == 1)
        return r + 1;
      return r - 1;
  }
}